

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinUtil.c
# Opt level: O1

void Min_CoverWriteStore(FILE *pFile,Min_Man_t *p)

{
  bool bVar1;
  Min_Cube_t *pCube;
  ulong uVar2;
  
  if (-1 < p->nVars) {
    uVar2 = 0;
    do {
      for (pCube = p->ppStore[uVar2]; pCube != (Min_Cube_t *)0x0; pCube = pCube->pNext) {
        printf("%2d : ",uVar2 & 0xffffffff);
        if (pCube == p->pBubble) {
          puts("Bubble");
        }
        else {
          Min_CubeWrite(pFile,pCube);
        }
      }
      bVar1 = (long)uVar2 < (long)p->nVars;
      uVar2 = uVar2 + 1;
    } while (bVar1);
  }
  putchar(10);
  return;
}

Assistant:

void Min_CoverWriteStore( FILE * pFile, Min_Man_t * p )
{
    Min_Cube_t * pCube;
    int i;
    for ( i = 0; i <= p->nVars; i++ )
    {
        Min_CoverForEachCube( p->ppStore[i], pCube )
        {
            printf( "%2d : ", i );
            if ( pCube == p->pBubble )
            {
                printf( "Bubble\n" );
                continue;
            }
            Min_CubeWrite( pFile, pCube );
        }
    }
    printf( "\n" );
}